

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdBeginRenderPass
          (CommandBuffer *this,Ptr<RenderPass> *render_pass,Ptr<Framebuffer> *framebuffer,
          vector<VkClearValue,_std::allocator<VkClearValue>_> *clear_values,
          VkSubpassContents subpass_contents)

{
  element_type *this_00;
  element_type *peVar1;
  VkExtent2D *pVVar2;
  size_type sVar3;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *in_RCX;
  long in_RDI;
  VkSubpassContents in_R8D;
  VkRenderPassBeginInfo render_begin_info;
  VkRenderPassBeginInfo local_68;
  VkSubpassContents local_24;
  vector<VkClearValue,_std::allocator<VkClearValue>_> *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  memset(&local_68,0,0x40);
  local_68.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  this_00 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2ac249);
  local_68.renderPass = RenderPass::GetHandle(this_00);
  peVar1 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ac260);
  local_68.framebuffer = FramebufferBase::GetHandle(&peVar1->super_FramebufferBase);
  local_68.renderArea.offset.x = 0;
  local_68.renderArea.offset.y = 0;
  peVar1 = std::__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ac291);
  pVVar2 = FramebufferBase::GetExtent(&peVar1->super_FramebufferBase);
  local_68.renderArea.extent = *pVVar2;
  sVar3 = std::vector<VkClearValue,_std::allocator<VkClearValue>_>::size(local_20);
  local_68.clearValueCount = (uint32_t)sVar3;
  local_68.pClearValues =
       std::vector<VkClearValue,_std::allocator<VkClearValue>_>::data
                 ((vector<VkClearValue,_std::allocator<VkClearValue>_> *)0x2ac2b9);
  (*vkCmdBeginRenderPass)(*(VkCommandBuffer *)(in_RDI + 0x28),&local_68,local_24);
  return;
}

Assistant:

void CommandBuffer::CmdBeginRenderPass(const Ptr<RenderPass> &render_pass, const Ptr<Framebuffer> &framebuffer,
                                       const std::vector<VkClearValue> &clear_values,
                                       VkSubpassContents subpass_contents) const {
	VkRenderPassBeginInfo render_begin_info = {};
	render_begin_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
	render_begin_info.renderPass = render_pass->GetHandle();
	render_begin_info.framebuffer = framebuffer->GetHandle();
	render_begin_info.renderArea.offset = {0, 0};
	render_begin_info.renderArea.extent = framebuffer->GetExtent();
	render_begin_info.clearValueCount = clear_values.size();
	render_begin_info.pClearValues = clear_values.data();

	vkCmdBeginRenderPass(m_command_buffer, &render_begin_info, subpass_contents);
}